

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O3

void __thiscall
HD44780AnalyzerResults::GenerateBubbleText
          (HD44780AnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  ushort uVar1;
  size_t sVar2;
  undefined4 uVar3;
  HD44780AnalyzerResults *this_00;
  Frame frame;
  char s1 [256];
  char number_str [128];
  char s2 [256];
  undefined8 local_308;
  undefined8 uStack_300;
  ulonglong local_2f8;
  undefined8 uStack_2f0;
  ushort local_2e8;
  short local_2d8;
  undefined1 auStack_2d6 [2];
  undefined2 local_2d4;
  undefined1 uStack_2d2;
  undefined1 auStack_2d0 [256];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  ulonglong local_1c0;
  undefined8 uStack_1b8;
  ushort local_1b0;
  char local_1a8 [128];
  char local_128 [264];
  
  Frame::Frame((Frame *)&local_308);
  AnalyzerResults::GetFrame((ulonglong)&local_1d0);
  local_2e8 = local_1b0;
  local_2f8 = local_1c0;
  uStack_2f0 = uStack_1b8;
  local_308 = local_1d0;
  uStack_300 = uStack_1c8;
  Frame::~Frame((Frame *)&local_1d0);
  AnalyzerResults::ClearResultStrings();
  AnalyzerHelpers::GetNumberString(local_2f8,display_base,8,local_1a8,0x80);
  strcpy((char *)&local_2d8,local_1a8);
  AnalyzerResults::AddResultString
            ((char *)this,(char *)&local_2d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  uVar1 = local_2e8;
  local_2d8 = (ushort)((local_2e8 & 0x200) == 0) * 5 + 0x52;
  sVar2 = strlen((char *)&local_2d8);
  if ((uVar1 & 0x100) == 0) {
    auStack_2d6[sVar2] = 0;
    *(undefined2 *)(auStack_2d6 + (sVar2 - 2)) = 0x2043;
  }
  else {
    auStack_2d6[sVar2] = 0;
    *(undefined2 *)(auStack_2d6 + (sVar2 - 2)) = 0x2044;
  }
  strcat((char *)&local_2d8,local_1a8);
  AnalyzerResults::AddResultString
            ((char *)this,(char *)&local_2d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  uVar1 = local_2e8;
  uVar3 = 0x206452;
  if ((local_2e8 & 0x200) == 0) {
    uVar3 = 0x207257;
  }
  local_2d8 = (short)uVar3;
  auStack_2d6[0] = (undefined1)((uint)uVar3 >> 0x10);
  auStack_2d6[1] = 0;
  sVar2 = strlen((char *)&local_2d8);
  uVar3 = 0x207444;
  if ((uVar1 & 0x100) == 0) {
    uVar3 = 0x206d43;
  }
  *(undefined4 *)(auStack_2d6 + (sVar2 - 2)) = uVar3;
  strcat((char *)&local_2d8,local_1a8);
  AnalyzerResults::AddResultString
            ((char *)this,(char *)&local_2d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  uVar1 = local_2e8;
  if ((local_2e8 & 0x200) == 0) {
    local_2d4 = 0x2065;
    uStack_2d2 = 0;
    local_2d8 = 0x7257;
    auStack_2d6[0] = 0x69;
    auStack_2d6[1] = 0x74;
  }
  else {
    local_2d4 = 0x20;
    local_2d8 = 0x6552;
    auStack_2d6[0] = 0x61;
    auStack_2d6[1] = 100;
  }
  sVar2 = strlen((char *)&local_2d8);
  if ((uVar1 & 0x100) == 0) {
    *(undefined8 *)(auStack_2d6 + (sVar2 - 2)) = 0x20646e616d6d6f43;
    auStack_2d0[sVar2] = 0;
  }
  else {
    *(undefined2 *)((long)&local_2d4 + sVar2) = 0x20;
    *(undefined4 *)(auStack_2d6 + (sVar2 - 2)) = 0x61746144;
  }
  strcat((char *)&local_2d8,local_1a8);
  this_00 = this;
  AnalyzerResults::AddResultString
            ((char *)this,(char *)&local_2d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  HD44780Decode(this_00,(Frame *)&local_308,local_128,display_base);
  sVar2 = strlen((char *)&local_2d8);
  *(undefined2 *)(auStack_2d6 + (sVar2 - 2)) = 0x2820;
  auStack_2d6[sVar2] = 0;
  strcat((char *)&local_2d8,local_128);
  sVar2 = strlen((char *)&local_2d8);
  *(undefined2 *)(auStack_2d6 + (sVar2 - 2)) = 0x29;
  AnalyzerResults::AddResultString
            ((char *)this,(char *)&local_2d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)&local_308);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    char s1[ 256 ], s2[ 256 ], number_str[ 128 ];
    Frame frame;

    frame = GetFrame( frame_index );
    ClearResultStrings();
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 1
    strcpy( s1, number_str );
    AddResultString( s1 );

    // string 2
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "R" );
    else
        strcpy( s1, "W" );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "D " );
    else
        strcat( s1, "C " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 3
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Rd " );
    else
        strcpy( s1, "Wr " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Dt " );
    else
        strcat( s1, "Cm " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    AddResultString( s1 );
}